

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  bool bVar1;
  long lVar2;
  iterator __position;
  optional<std::__cxx11::string> *this_00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  char local_a9;
  anon_class_8_1_8991fb9c apply_diff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  
  apply_diff.this = this;
  lVar2 = std::__cxx11::string::find((char)envmod,0x3d);
  if (lVar2 == -1) {
    op._M_dataplus._M_p._0_1_ = 10;
    cmStrCat<char_const(&)[48],std::__cxx11::string_const&,char>
              (&name,(char (*) [48])"Error: Missing `=` after the variable name in: ",envmod,
               (char *)&op);
    Error(&name);
    std::__cxx11::string::~string((string *)&name);
    return false;
  }
  std::__cxx11::string::substr((ulong)&name,(ulong)envmod);
  lVar2 = std::__cxx11::string::find((char)envmod,0x3a);
  if (lVar2 == -1) {
    value._M_dataplus._M_p._0_1_ = 10;
    cmStrCat<char_const(&)[44],std::__cxx11::string_const&,char>
              (&op,(char (*) [44])"Error: Missing `:` after the operation in: ",envmod,
               (char *)&value);
    Error(&op);
    std::__cxx11::string::~string((string *)&op);
    bVar1 = false;
    goto LAB_00114d41;
  }
  std::__cxx11::string::substr((ulong)&op,(ulong)envmod);
  std::__cxx11::string::substr((ulong)&value,(ulong)envmod);
  __x._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
  __x._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
  __x._M_len = op._M_string_length;
  __y._M_str = "reset";
  __y._M_len = 5;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)this,&name);
    bVar1 = true;
    if (__position._M_node != (_Base_ptr)&this->field_0x8) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          *)this,__position);
    }
  }
  else {
    __x_00._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
    __x_00._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
    __x_00._M_len = op._M_string_length;
    __y_00._M_str = "set";
    __y_00._M_len = 3;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      this_00 = (optional<std::__cxx11::string> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->diff,&name);
      bVar1 = true;
      std::optional<std::__cxx11::string>::operator=(this_00,&value);
    }
    else {
      __x_01._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
      __x_01._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
      __x_01._M_len = op._M_string_length;
      __y_01._M_str = "unset";
      __y_01._M_len = 5;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        this_01 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&this->diff,&name);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(this_01);
      }
      else {
        __x_02._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
        __x_02._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
        __x_02._M_len = op._M_string_length;
        __y_02._M_str = "string_append";
        __y_02._M_len = 0xd;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          local_80._8_8_ = 0;
          local_68 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
                     ::_M_invoke;
          local_70 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
                     ::_M_manager;
          local_80._M_unused._M_object = &value;
          ParseOperation::anon_class_8_1_8991fb9c::operator()
                    (&apply_diff,&name,
                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_80);
        }
        else {
          __x_03._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
          __x_03._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
          __x_03._M_len = op._M_string_length;
          __y_03._M_str = "string_prepend";
          __y_03._M_len = 0xe;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            local_80._8_8_ = 0;
            local_68 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
                       ::_M_invoke;
            local_70 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
                       ::_M_manager;
            local_80._M_unused._M_object = &value;
            ParseOperation::anon_class_8_1_8991fb9c::operator()
                      (&apply_diff,&name,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_80);
          }
          else {
            __x_04._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
            __x_04._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
            __x_04._M_len = op._M_string_length;
            __y_04._M_str = "path_list_append";
            __y_04._M_len = 0x10;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              local_80._8_8_ = 0x3a;
              local_68 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
                         ::_M_invoke;
              local_70 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
                         ::_M_manager;
              local_80._M_unused._M_object = &value;
              ParseOperation::anon_class_8_1_8991fb9c::operator()
                        (&apply_diff,&name,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_80);
            }
            else {
              __x_05._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
              __x_05._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
              __x_05._M_len = op._M_string_length;
              __y_05._M_str = "path_list_prepend";
              __y_05._M_len = 0x11;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                local_80._8_8_ = 0x3a;
                local_68 = std::
                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
                           ::_M_invoke;
                local_70 = std::
                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
                           ::_M_manager;
                local_80._M_unused._M_object = &value;
                ParseOperation::anon_class_8_1_8991fb9c::operator()
                          (&apply_diff,&name,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_80);
              }
              else {
                __x_06._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
                __x_06._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
                __x_06._M_len = op._M_string_length;
                __y_06._M_str = "cmake_list_append";
                __y_06._M_len = 0x11;
                bVar1 = std::operator==(__x_06,__y_06);
                if (bVar1) {
                  local_80._8_8_ = 0;
                  local_68 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
                             ::_M_invoke;
                  local_70 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
                             ::_M_manager;
                  local_80._M_unused._M_object = &value;
                  ParseOperation::anon_class_8_1_8991fb9c::operator()
                            (&apply_diff,&name,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_80);
                }
                else {
                  __x_07._M_str._1_7_ = op._M_dataplus._M_p._1_7_;
                  __x_07._M_str._0_1_ = op._M_dataplus._M_p._0_1_;
                  __x_07._M_len = op._M_string_length;
                  __y_07._M_str = "cmake_list_prepend";
                  __y_07._M_len = 0x12;
                  bVar1 = std::operator==(__x_07,__y_07);
                  if (!bVar1) {
                    local_a9 = '\n';
                    cmStrCat<char_const(&)[56],std::__cxx11::string_const&,char>
                              ((string *)&local_80,
                               (char (*) [56])
                               "Error: Unrecognized environment manipulation argument: ",&op,
                               &local_a9);
                    Error((string *)&local_80);
                    std::__cxx11::string::~string((string *)local_80._M_pod_data);
                    bVar1 = false;
                    goto LAB_00114d2d;
                  }
                  local_80._8_8_ = 0;
                  local_68 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
                             ::_M_invoke;
                  local_70 = std::
                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
                             ::_M_manager;
                  local_80._M_unused._M_object = &value;
                  ParseOperation::anon_class_8_1_8991fb9c::operator()
                            (&apply_diff,&name,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_80);
                }
              }
            }
          }
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_80);
      }
      bVar1 = true;
    }
  }
LAB_00114d2d:
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&op);
LAB_00114d41:
  std::__cxx11::string::~string((string *)&name);
  return bVar1;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = cm::nullopt;
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}